

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

void __thiscall bidfx_public_api::price::PricingSession::Stop(PricingSession *this)

{
  Stop((PricingSession *)&this[-1].subscriptions_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void PricingSession::Stop()
{
    if (!running_.exchange(false))
    {
        return;
    }
    Log->info("stopping");
    subscriptions_.clear();
    pixie_provider_->Stop();
    return;
}